

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::ItemSimilarityRecommender::_InternalParse
          (ItemSimilarityRecommender *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  undefined1 uVar3;
  ItemSimilarityRecommender_SimilarItems *msg;
  StringVector *msg_00;
  Int64Vector *msg_01;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_5;
  string *str_4;
  string *str_3;
  string *str_2;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  ItemSimilarityRecommender *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0049388f:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    pPVar1 = pPStack_20;
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 1:
      if ((str._4_4_ & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_itemitemsimilarities(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)(ParseContext *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar2));
        goto LAB_0049388f;
      }
      break;
    case 2:
      if ((str._4_4_ & 0xff) != 0x12) break;
      msg_00 = _internal_mutable_itemstringids(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (pPVar1,&msg_00->super_MessageLite,(char *)ctx_local);
      goto joined_r0x00493c6e;
    case 3:
      if ((str._4_4_ & 0xff) == 0x1a) {
        msg_01 = _internal_mutable_itemint64ids(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (pPVar1,&msg_01->super_MessageLite,(char *)ctx_local);
        goto joined_r0x00493c6e;
      }
      break;
    default:
      break;
    case 10:
      if ((str._4_4_ & 0xff) == 0x52) {
        psVar4 = _internal_mutable_iteminputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
joined_r0x00493c59:
        if (((uVar3 ^ 0xff) & 1) != 0) {
          return (char *)(ParseContext *)0x0;
        }
        goto joined_r0x00493c6e;
      }
      break;
    case 0xb:
      if ((str._4_4_ & 0xff) == 0x5a) {
        psVar4 = _internal_mutable_numrecommendationsinputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x00493c59;
      }
      break;
    case 0xc:
      if ((str._4_4_ & 0xff) == 0x62) {
        psVar4 = _internal_mutable_itemrestrictioninputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x00493c59;
      }
      break;
    case 0xd:
      if ((str._4_4_ & 0xff) == 0x6a) {
        psVar4 = _internal_mutable_itemexclusioninputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x00493c59;
      }
      break;
    case 0x14:
      if ((str._4_4_ & 0xff) == 0xa2) {
        psVar4 = _internal_mutable_recommendeditemlistoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x00493c59;
      }
      break;
    case 0x15:
      if ((str._4_4_ & 0xff) == 0xaa) {
        psVar4 = _internal_mutable_recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar4,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar4,(char *)0x0);
        goto joined_r0x00493c59;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)(ParseContext *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x00493c6e:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* ItemSimilarityRecommender::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_itemitemsimilarities(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector itemStringIds = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemstringids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemint64ids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_iteminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string numRecommendationsInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_numrecommendationsinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemRestrictionInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_itemrestrictioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemExclusionInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_itemexclusioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemListOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_recommendeditemlistoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemScoreOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_recommendeditemscoreoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}